

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O0

bool __thiscall
cmGlobVerificationManager::SaveVerificationScript(cmGlobVerificationManager *this,string *path)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  reference __in;
  type *ptVar5;
  type *ptVar6;
  pointer *this_00;
  type *ptVar7;
  type *this_01;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  undefined1 local_5e8 [8];
  ofstream verifyStampFile;
  string *file;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string local_3c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  *local_3a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  *bt;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
  *__range2;
  CacheEntryValue v;
  CacheEntryKey k;
  pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>
  *i;
  iterator __end1;
  iterator __begin1;
  CacheEntryMap *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [8];
  cmGeneratedFileStream verifyScriptFile;
  string stampFile;
  undefined1 local_40 [8];
  string scriptFile;
  string *path_local;
  cmGlobVerificationManager *this_local;
  
  scriptFile.field_2._8_8_ = path;
  bVar1 = std::
          map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
          ::empty(&this->Cache);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::string((string *)local_40,(string *)scriptFile.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_40,"/CMakeFiles");
    std::__cxx11::string::string((string *)&verifyScriptFile.field_0x240,(string *)local_40);
    cmsys::SystemTools::MakeDirectory((string *)local_40,(mode_t *)0x0);
    std::__cxx11::string::operator+=((string *)local_40,"/VerifyGlobs.cmake");
    std::__cxx11::string::operator+=((string *)&verifyScriptFile.field_0x240,"/cmake.verify_globs");
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_2b8,(string *)local_40,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2b8,true);
    bVar2 = std::ios::operator!((ios *)(local_2b8 + (long)*(_func_int **)((long)local_2b8 + -0x18)))
    ;
    if ((bVar2 & 1) == 0) {
      std::ostream::operator<<(local_2b8,std::boolalpha);
      poVar4 = std::operator<<((ostream *)local_2b8,"# CMAKE generated file: DO NOT EDIT!\n");
      poVar4 = std::operator<<(poVar4,"# Generated by CMake Version ");
      uVar3 = cmVersion::GetMajorVersion();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      poVar4 = std::operator<<(poVar4,".");
      uVar3 = cmVersion::GetMinorVersion();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      std::operator<<(poVar4,"\n");
      __end1 = std::
               map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
               ::begin(&this->Cache);
      i = (pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>
           *)std::
             map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
             ::end(&this->Cache);
      while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
        __in = std::
               _Rb_tree_iterator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>
               ::operator*(&__end1);
        ptVar5 = std::
                 get<0ul,cmGlobVerificationManager::CacheEntryKey_const,cmGlobVerificationManager::CacheEntryValue>
                           (__in);
        CacheEntryKey::CacheEntryKey
                  ((CacheEntryKey *)
                   &v.Backtraces.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,ptVar5);
        ptVar6 = std::
                 get<1ul,cmGlobVerificationManager::CacheEntryKey_const,cmGlobVerificationManager::CacheEntryValue>
                           (__in);
        CacheEntryValue::CacheEntryValue((CacheEntryValue *)&__range2,ptVar6);
        if (((byte)__range2 & 1) != 0) {
          std::operator<<((ostream *)local_2b8,"\n");
          this_00 = &v.Files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end2 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                   ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                            *)this_00);
          bt = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                         *)this_00);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
                                             *)&bt), bVar1) {
            local_3a0 = __gnu_cxx::
                        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
                        ::operator*(&__end2);
            poVar4 = std::operator<<((ostream *)local_2b8,"# ");
            ptVar7 = std::get<0ul,std::__cxx11::string,cmListFileBacktrace>(local_3a0);
            std::operator<<(poVar4,(string *)ptVar7);
            this_01 = std::get<1ul,std::__cxx11::string,cmListFileBacktrace>(local_3a0);
            cmListFileBacktrace::PrintTitle(this_01,(ostream *)local_2b8);
            std::operator<<((ostream *)local_2b8,"\n");
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
            ::operator++(&__end2);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c0,"NEW_GLOB",(allocator<char> *)((long)&__range2_1 + 7));
          CacheEntryKey::PrintGlobCommand
                    ((CacheEntryKey *)
                     &v.Backtraces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(ostream *)local_2b8,
                     &local_3c0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
          std::operator<<((ostream *)local_2b8,"\n");
          std::operator<<((ostream *)local_2b8,"set(OLD_GLOB\n");
          __end2_1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&v);
          file = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&v);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2_1,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&file), bVar1) {
            verifyStampFile._504_8_ =
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2_1);
            poVar4 = std::operator<<((ostream *)local_2b8,"  \"");
            poVar4 = std::operator<<(poVar4,(string *)verifyStampFile._504_8_);
            std::operator<<(poVar4,"\"\n");
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end2_1);
          }
          std::operator<<((ostream *)local_2b8,"  )\n");
          poVar4 = std::operator<<((ostream *)local_2b8,
                                   "if(NOT \"${NEW_GLOB}\" STREQUAL \"${OLD_GLOB}\")\n");
          poVar4 = std::operator<<(poVar4,"  message(\"-- GLOB mismatch!\")\n");
          poVar4 = std::operator<<(poVar4,"  file(TOUCH_NOCREATE \"");
          poVar4 = std::operator<<(poVar4,(string *)&verifyScriptFile.field_0x240);
          poVar4 = std::operator<<(poVar4,"\")\n");
          std::operator<<(poVar4,"endif()\n");
        }
        CacheEntryValue::~CacheEntryValue((CacheEntryValue *)&__range2);
        CacheEntryKey::~CacheEntryKey
                  ((CacheEntryKey *)
                   &v.Backtraces.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        _Rb_tree_iterator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>
        ::operator++(&__end1);
      }
      cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_2b8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_5e8,pcVar8,_S_out);
      bVar2 = std::ios::operator!((ios *)(local_5e8 + (long)*(_func_int **)((long)local_5e8 + -0x18)
                                         ));
      bVar1 = (bVar2 & 1) != 0;
      if (bVar1) {
        std::operator+(&local_608,"Unable to open verification stamp file for write. ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &verifyScriptFile.field_0x240);
        cmSystemTools::Error(&local_608);
        std::__cxx11::string::~string((string *)&local_608);
      }
      else {
        std::operator<<((ostream *)local_5e8,
                        "# This file is generated by CMake for checking of the VerifyGlobs.cmake file\n"
                       );
        std::__cxx11::string::operator=((string *)&this->VerifyScript,(string *)local_40);
        std::__cxx11::string::operator=
                  ((string *)&this->VerifyStamp,(string *)&verifyScriptFile.field_0x240);
      }
      this_local._7_1_ = !bVar1;
      std::ofstream::~ofstream(local_5e8);
    }
    else {
      std::operator+(&local_2d8,"Unable to open verification script file for save. ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      cmSystemTools::Error(&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      cmSystemTools::ReportLastSystemError("");
      this_local._7_1_ = false;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b8);
    std::__cxx11::string::~string((string *)&verifyScriptFile.field_0x240);
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobVerificationManager::SaveVerificationScript(const std::string& path)
{
  if (this->Cache.empty()) {
    return true;
  }

  std::string scriptFile = path;
  scriptFile += "/CMakeFiles";
  std::string stampFile = scriptFile;
  cmSystemTools::MakeDirectory(scriptFile);
  scriptFile += "/VerifyGlobs.cmake";
  stampFile += "/cmake.verify_globs";
  cmGeneratedFileStream verifyScriptFile(scriptFile);
  verifyScriptFile.SetCopyIfDifferent(true);
  if (!verifyScriptFile) {
    cmSystemTools::Error("Unable to open verification script file for save. " +
                         scriptFile);
    cmSystemTools::ReportLastSystemError("");
    return false;
  }

  verifyScriptFile << std::boolalpha;
  verifyScriptFile << "# CMAKE generated file: DO NOT EDIT!\n"
                   << "# Generated by CMake Version "
                   << cmVersion::GetMajorVersion() << "."
                   << cmVersion::GetMinorVersion() << "\n";

  for (auto const& i : this->Cache) {
    CacheEntryKey k = std::get<0>(i);
    CacheEntryValue v = std::get<1>(i);

    if (!v.Initialized) {
      continue;
    }

    verifyScriptFile << "\n";

    for (auto const& bt : v.Backtraces) {
      verifyScriptFile << "# " << std::get<0>(bt);
      std::get<1>(bt).PrintTitle(verifyScriptFile);
      verifyScriptFile << "\n";
    }

    k.PrintGlobCommand(verifyScriptFile, "NEW_GLOB");
    verifyScriptFile << "\n";

    verifyScriptFile << "set(OLD_GLOB\n";
    for (const std::string& file : v.Files) {
      verifyScriptFile << "  \"" << file << "\"\n";
    }
    verifyScriptFile << "  )\n";

    verifyScriptFile << "if(NOT \"${NEW_GLOB}\" STREQUAL \"${OLD_GLOB}\")\n"
                     << "  message(\"-- GLOB mismatch!\")\n"
                     << "  file(TOUCH_NOCREATE \"" << stampFile << "\")\n"
                     << "endif()\n";
  }
  verifyScriptFile.Close();

  cmsys::ofstream verifyStampFile(stampFile.c_str());
  if (!verifyStampFile) {
    cmSystemTools::Error("Unable to open verification stamp file for write. " +
                         stampFile);
    return false;
  }
  verifyStampFile << "# This file is generated by CMake for checking of the "
                     "VerifyGlobs.cmake file\n";
  this->VerifyScript = scriptFile;
  this->VerifyStamp = stampFile;
  return true;
}